

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkUnrollAndDrop(Abc_Ntk_t *p,int nFrames,int nFramesAdd,Vec_Int_t *vFlops,int *piPivot)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  if (nFramesAdd < 0) {
    __assert_fail("nFramesAdd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x126,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  if (p->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x127,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  if (vFlops->nSize != p->nObjCounts[8]) {
    __assert_fail("Vec_IntSize(vFlops) == Abc_NtkLatchNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x128,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  *piPivot = -1;
  pNtk = Abc_NtkAlloc(p->ntkType,p->ntkFunc,1);
  pcVar5 = Extra_UtilStrsav(p->pName);
  pNtk->pName = pcVar5;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar10];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar6;
      lVar10 = lVar10 + 1;
      pVVar7 = p->vCis;
    } while (lVar10 < pVVar7->nSize);
  }
  iVar4 = 0;
  pVVar7 = Abc_NtkDfs(p,0);
  if (-1 < nFrames + nFramesAdd) {
    do {
      if ((iVar4 != 0) && (pVVar8 = p->vPis, 0 < pVVar8->nSize)) {
        lVar10 = 0;
        do {
          pvVar1 = pVVar8->pArray[lVar10];
          pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
          *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar6;
          lVar10 = lVar10 + 1;
          pVVar8 = p->vPis;
        } while (lVar10 < pVVar8->nSize);
      }
      if (0 < pVVar7->nSize) {
        lVar10 = 0;
        do {
          pAVar6 = (Abc_Obj_t *)pVVar7->pArray[lVar10];
          Abc_NtkDupObj(pNtk,pAVar6,0);
          if (0 < (pAVar6->vFanins).nSize) {
            lVar11 = 0;
            do {
              Abc_ObjAddFanin((pAVar6->field_6).pCopy,
                              *(Abc_Obj_t **)
                               ((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar11]]
                               + 0x40));
              lVar11 = lVar11 + 1;
            } while (lVar11 < (pAVar6->vFanins).nSize);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar7->nSize);
      }
      pVVar8 = p->vCos;
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          plVar2 = (long *)pVVar8->pArray[lVar10];
          plVar2[8] = *(long *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)plVar2[4] * 8) + 0x40);
          lVar10 = lVar10 + 1;
          pVVar8 = p->vCos;
        } while (lVar10 < pVVar8->nSize);
      }
      pVVar8 = p->vPos;
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          pvVar1 = pVVar8->pArray[lVar10];
          pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)((long)pvVar1 + 0x40));
          lVar10 = lVar10 + 1;
          pVVar8 = p->vPos;
        } while (lVar10 < pVVar8->nSize);
      }
      if (iVar4 == 0) {
        *piPivot = pNtk->nObjs;
      }
      pVVar8 = p->vBoxes;
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          plVar2 = (long *)pVVar8->pArray[lVar10];
          if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
            lVar11 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
            *(undefined8 *)(*(long *)(lVar11 + (long)*(int *)plVar2[6] * 8) + 0x40) =
                 *(undefined8 *)(*(long *)(lVar11 + (long)*(int *)plVar2[4] * 8) + 0x40);
            pVVar8 = p->vBoxes;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar8->nSize);
      }
      if ((nFramesAdd < iVar4) && (iVar3 = vFlops->nSize, 0 < iVar3)) {
        lVar10 = 0;
        do {
          if (vFlops->pArray[lVar10] != 0) {
            uVar9 = (ulong)(uint)p->vPos->nSize + lVar10;
            iVar3 = (int)uVar9;
            if ((iVar3 < 0) || (p->vCos->nSize <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar1 = p->vCos->pArray[uVar9 & 0xffffffff];
            pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
            Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)((long)pvVar1 + 0x40));
            iVar3 = vFlops->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar3);
      }
      bVar12 = iVar4 != nFrames + nFramesAdd;
      iVar4 = iVar4 + 1;
    } while (bVar12);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  Abc_NtkCleanup(pNtk,0);
  iVar4 = Abc_NtkCheck(pNtk);
  if (iVar4 == 0) {
    fwrite("Abc_NtkCreateFromNode(): Network check has failed.\n",0x33,1,_stdout);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkUnrollAndDrop( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, int * piPivot )
{
    Abc_Ntk_t * pNtk; 
    Abc_Obj_t * pFanin, * pNode;
    Vec_Ptr_t * vNodes;
    int i, k, f, Value;
    assert( nFramesAdd >= 0 );
    assert( Abc_NtkIsLogic(p) );
    assert( Vec_IntSize(vFlops) == Abc_NtkLatchNum(p) );
    *piPivot = -1;
    // start the network
    pNtk = Abc_NtkAlloc( p->ntkType, p->ntkFunc, 1 );
    pNtk->pName = Extra_UtilStrsav(Abc_NtkName(p));
    // add CIs for the new network
    Abc_NtkForEachCi( p, pNode, i )
        pNode->pCopy = Abc_NtkCreatePi( pNtk );
    // iterate unrolling
    vNodes = Abc_NtkDfs( p, 0 );
    for ( f = 0; f <= nFrames + nFramesAdd; f++ )
    {
        if ( f > 0 )
        {
            Abc_NtkForEachPi( p, pNode, i )
                pNode->pCopy = Abc_NtkCreatePi( pNtk );
        }
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            Abc_NtkDupObj( pNtk, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        Abc_NtkForEachCo( p, pNode, i )
            pNode->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        Abc_NtkForEachPo( p, pNode, i )
            Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
        // add buffers
        if ( f == 0 )
        {
            *piPivot = Abc_NtkObjNum(pNtk);
//            Abc_NtkForEachLatchInput( p, pNode, i )
//                pNode->pCopy = Abc_NtkCreateNodeBuf( pNtk, pNode->pCopy );
        }
        // transfer to flop outputs
        Abc_NtkForEachLatch( p, pNode, i )
            Abc_ObjFanout0(pNode)->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        // add final POs
        if ( f > nFramesAdd )
        {
            Vec_IntForEachEntry( vFlops, Value, i )
            {
                if ( Value == 0 )
                    continue;
                pNode = Abc_NtkCo( p, Abc_NtkPoNum(p) + i );
                Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    // perform combinational cleanup
    Abc_NtkCleanup( pNtk, 0 );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkCreateFromNode(): Network check has failed.\n" );
    return pNtk;
}